

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  byte bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  uint uVar44;
  uint uVar45;
  undefined1 (*pauVar46) [16];
  long lVar47;
  ulong uVar48;
  uint uVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  long lVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  ulong uVar55;
  undefined1 (*pauVar56) [16];
  ulong uVar57;
  long lVar58;
  undefined1 auVar67 [16];
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar68 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar84;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar96;
  undefined1 auVar91 [32];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  __m128 a;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar140;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar141;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar154 [32];
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar155 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a41;
  undefined1 (*local_2a40) [16];
  ulong local_2a38;
  ulong local_2a30;
  ulong local_2a28;
  ulong local_2a20;
  ulong local_2a18;
  uint local_2a10;
  uint local_2a0c;
  ulong local_2a08;
  undefined1 local_2a00 [16];
  undefined1 local_29f0 [16];
  undefined1 (*local_29d8) [16];
  ulong local_29d0;
  ulong local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  long local_29a0;
  long local_2998;
  long local_2990;
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  float fStack_28e4;
  undefined1 local_28e0 [16];
  undefined1 auStack_28d0 [16];
  undefined1 local_28c0 [16];
  undefined1 auStack_28b0 [16];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 *local_27c0;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720 [4];
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700 [4];
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26e0 [4];
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  float local_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 local_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined1 local_2650 [16];
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [8];
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar46 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2920._4_4_ = uVar1;
  local_2920._0_4_ = uVar1;
  local_2920._8_4_ = uVar1;
  local_2920._12_4_ = uVar1;
  local_2920._16_4_ = uVar1;
  local_2920._20_4_ = uVar1;
  local_2920._24_4_ = uVar1;
  local_2920._28_4_ = uVar1;
  auVar126 = ZEXT3264(local_2920);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2940._4_4_ = uVar1;
  local_2940._0_4_ = uVar1;
  local_2940._8_4_ = uVar1;
  local_2940._12_4_ = uVar1;
  local_2940._16_4_ = uVar1;
  local_2940._20_4_ = uVar1;
  local_2940._24_4_ = uVar1;
  local_2940._28_4_ = uVar1;
  auVar132 = ZEXT3264(local_2940);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2540._4_4_ = uVar1;
  local_2540._0_4_ = uVar1;
  local_2540._8_4_ = uVar1;
  local_2540._12_4_ = uVar1;
  local_2540._16_4_ = uVar1;
  local_2540._20_4_ = uVar1;
  local_2540._24_4_ = uVar1;
  local_2540._28_4_ = uVar1;
  auVar145 = ZEXT3264(local_2540);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar95 = fVar103 * 0.99999964;
  fStack_2824 = fVar86 * 0.99999964;
  fVar97 = fVar93 * 0.99999964;
  fVar103 = fVar103 * 1.0000004;
  local_2860._4_4_ = fVar103;
  local_2860._0_4_ = fVar103;
  fStack_2858 = fVar103;
  fStack_2854 = fVar103;
  fStack_2850 = fVar103;
  fStack_284c = fVar103;
  fStack_2848 = fVar103;
  register0x0000131c = fVar103;
  auVar116 = ZEXT3264(_local_2860);
  fVar86 = fVar86 * 1.0000004;
  fVar93 = fVar93 * 1.0000004;
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar64 = uVar59 ^ 0x20;
  uVar62 = uVar60 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_25c0._4_4_ = iVar2;
  local_25c0._0_4_ = iVar2;
  local_25c0._8_4_ = iVar2;
  local_25c0._12_4_ = iVar2;
  local_25c0._16_4_ = iVar2;
  local_25c0._20_4_ = iVar2;
  local_25c0._24_4_ = iVar2;
  local_25c0._28_4_ = iVar2;
  auVar170 = ZEXT3264(local_25c0);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar171 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(
                                                  iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  uVar57 = uVar61 ^ 0x20;
  local_29a8 = uVar59 >> 2;
  local_25e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_25e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_29b0 = uVar64 >> 2;
  local_29d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_29b8 = uVar60 >> 2;
  local_29c0 = uVar62 >> 2;
  local_29c8 = uVar61 >> 2;
  local_29d0 = uVar57 >> 2;
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar68._8_4_ = 0xbf800000;
  auVar68._0_8_ = 0xbf800000bf800000;
  auVar68._12_4_ = 0xbf800000;
  auVar68._16_4_ = 0xbf800000;
  auVar68._20_4_ = 0xbf800000;
  auVar68._24_4_ = 0xbf800000;
  auVar68._28_4_ = 0xbf800000;
  _local_2600 = vblendvps_avx(auVar88,auVar68,local_25e0);
  local_2620 = fVar95;
  fStack_261c = fVar95;
  fStack_2618 = fVar95;
  fStack_2614 = fVar95;
  fStack_2610 = fVar95;
  fStack_260c = fVar95;
  fStack_2608 = fVar95;
  fStack_2604 = fVar95;
  local_2560 = fVar97;
  fStack_255c = fVar97;
  fStack_2558 = fVar97;
  fStack_2554 = fVar97;
  fStack_2550 = fVar97;
  fStack_254c = fVar97;
  fStack_2548 = fVar97;
  fStack_2544 = fVar97;
  local_2580 = fVar86;
  fStack_257c = fVar86;
  fStack_2578 = fVar86;
  fStack_2574 = fVar86;
  fStack_2570 = fVar86;
  fStack_256c = fVar86;
  fStack_2568 = fVar86;
  fStack_2564 = fVar86;
  local_25a0 = fVar93;
  fStack_259c = fVar93;
  fStack_2598 = fVar93;
  fStack_2594 = fVar93;
  fStack_2590 = fVar93;
  fStack_258c = fVar93;
  fStack_2588 = fVar93;
  fStack_2584 = fVar93;
  fStack_2828 = fStack_2824;
  fStack_282c = fStack_2824;
  fStack_2830 = fStack_2824;
  fStack_2834 = fStack_2824;
  fStack_2838 = fStack_2824;
  fStack_283c = fStack_2824;
  local_2840 = fStack_2824;
  local_2a18 = uVar59;
  local_2a20 = uVar60;
  local_2a28 = uVar61;
  local_2a30 = uVar64;
  local_2a38 = uVar62;
  fVar157 = fVar93;
  fVar153 = fVar93;
  fVar151 = fVar93;
  fVar150 = fVar93;
  fVar149 = fVar93;
  fVar148 = fVar93;
  fVar147 = fVar86;
  fVar146 = fVar86;
  fVar141 = fVar86;
  fVar84 = fVar86;
  fVar83 = fVar86;
  fVar82 = fVar86;
  fVar164 = fVar97;
  fVar162 = fVar97;
  fVar160 = fVar97;
  fVar158 = fVar97;
  fVar156 = fVar97;
  fVar152 = fVar97;
  fVar140 = fVar95;
  fVar102 = fVar95;
  fVar100 = fVar95;
  fVar98 = fVar95;
  fVar96 = fVar95;
  fVar94 = fVar95;
  fVar92 = fStack_2824;
  fVar74 = fStack_2824;
  fVar85 = fStack_2824;
  fVar104 = fStack_2824;
  fVar101 = fStack_2824;
  fVar99 = fStack_2824;
  fVar103 = fStack_2824;
LAB_005fd984:
  do {
    pauVar56 = pauVar46 + -1;
    pauVar46 = pauVar46 + -1;
    if (*(float *)(*pauVar56 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar63 = *(ulong *)*pauVar46;
joined_r0x005fd9a3:
      if ((uVar63 & 8) == 0) {
        auVar68 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar59),auVar126._0_32_);
        auVar18._4_4_ = fVar96 * auVar68._4_4_;
        auVar18._0_4_ = fVar94 * auVar68._0_4_;
        auVar18._8_4_ = fVar98 * auVar68._8_4_;
        auVar18._12_4_ = fVar100 * auVar68._12_4_;
        auVar18._16_4_ = fVar102 * auVar68._16_4_;
        auVar18._20_4_ = fVar140 * auVar68._20_4_;
        auVar18._24_4_ = fVar95 * auVar68._24_4_;
        auVar18._28_4_ = auVar68._28_4_;
        auVar68 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar60),auVar132._0_32_);
        auVar19._4_4_ = fVar99 * auVar68._4_4_;
        auVar19._0_4_ = fVar103 * auVar68._0_4_;
        auVar19._8_4_ = fVar101 * auVar68._8_4_;
        auVar19._12_4_ = fVar104 * auVar68._12_4_;
        auVar19._16_4_ = fVar85 * auVar68._16_4_;
        auVar19._20_4_ = fVar74 * auVar68._20_4_;
        auVar19._24_4_ = fVar92 * auVar68._24_4_;
        auVar19._28_4_ = auVar68._28_4_;
        auVar68 = vmaxps_avx(auVar18,auVar19);
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar61),auVar145._0_32_);
        auVar20._4_4_ = fVar156 * auVar88._4_4_;
        auVar20._0_4_ = fVar152 * auVar88._0_4_;
        auVar20._8_4_ = fVar158 * auVar88._8_4_;
        auVar20._12_4_ = fVar160 * auVar88._12_4_;
        auVar20._16_4_ = fVar162 * auVar88._16_4_;
        auVar20._20_4_ = fVar164 * auVar88._20_4_;
        auVar20._24_4_ = fVar97 * auVar88._24_4_;
        auVar20._28_4_ = auVar88._28_4_;
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar64),auVar126._0_32_);
        auVar21._4_4_ = auVar116._4_4_ * auVar88._4_4_;
        auVar21._0_4_ = auVar116._0_4_ * auVar88._0_4_;
        auVar21._8_4_ = auVar116._8_4_ * auVar88._8_4_;
        auVar21._12_4_ = auVar116._12_4_ * auVar88._12_4_;
        auVar21._16_4_ = auVar116._16_4_ * auVar88._16_4_;
        auVar21._20_4_ = auVar116._20_4_ * auVar88._20_4_;
        auVar21._24_4_ = auVar116._24_4_ * auVar88._24_4_;
        auVar21._28_4_ = auVar88._28_4_;
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar62),auVar132._0_32_);
        auVar22._4_4_ = fVar83 * auVar88._4_4_;
        auVar22._0_4_ = fVar82 * auVar88._0_4_;
        auVar22._8_4_ = fVar84 * auVar88._8_4_;
        auVar22._12_4_ = fVar141 * auVar88._12_4_;
        auVar22._16_4_ = fVar146 * auVar88._16_4_;
        auVar22._20_4_ = fVar147 * auVar88._20_4_;
        auVar22._24_4_ = fVar86 * auVar88._24_4_;
        auVar22._28_4_ = auVar88._28_4_;
        auVar12 = vminps_avx(auVar21,auVar22);
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar63 + 0x40 + uVar57),auVar145._0_32_);
        auVar23._4_4_ = fVar149 * auVar88._4_4_;
        auVar23._0_4_ = fVar148 * auVar88._0_4_;
        auVar23._8_4_ = fVar150 * auVar88._8_4_;
        auVar23._12_4_ = fVar151 * auVar88._12_4_;
        auVar23._16_4_ = fVar153 * auVar88._16_4_;
        auVar23._20_4_ = fVar157 * auVar88._20_4_;
        auVar23._24_4_ = fVar93 * auVar88._24_4_;
        auVar23._28_4_ = auVar88._28_4_;
        auVar88 = vmaxps_avx(auVar20,auVar170._0_32_);
        local_2820 = vmaxps_avx(auVar68,auVar88);
        auVar68 = vminps_avx(auVar23,auVar171._0_32_);
        auVar68 = vminps_avx(auVar12,auVar68);
        auVar68 = vcmpps_avx(local_2820,auVar68,2);
        uVar49 = vmovmskps_avx(auVar68);
        if (uVar49 == 0) {
          if (pauVar46 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005fd984;
        }
        uVar49 = uVar49 & 0xff;
        uVar48 = uVar63 & 0xfffffffffffffff0;
        lVar47 = 0;
        for (uVar63 = (ulong)uVar49; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
          lVar47 = lVar47 + 1;
        }
        uVar63 = *(ulong *)(uVar48 + lVar47 * 8);
        uVar49 = uVar49 - 1 & uVar49;
        uVar50 = (ulong)uVar49;
        if (uVar49 != 0) {
          uVar45 = *(uint *)(local_2820 + lVar47 * 4);
          lVar47 = 0;
          for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
            lVar47 = lVar47 + 1;
          }
          uVar49 = uVar49 - 1 & uVar49;
          uVar55 = (ulong)uVar49;
          uVar50 = *(ulong *)(uVar48 + lVar47 * 8);
          uVar44 = *(uint *)(local_2820 + lVar47 * 4);
          if (uVar49 == 0) {
            if (uVar45 < uVar44) {
              *(ulong *)*pauVar46 = uVar50;
              *(uint *)(*pauVar46 + 8) = uVar44;
              pauVar46 = pauVar46 + 1;
            }
            else {
              *(ulong *)*pauVar46 = uVar63;
              *(uint *)(*pauVar46 + 8) = uVar45;
              pauVar46 = pauVar46 + 1;
              uVar63 = uVar50;
            }
          }
          else {
            auVar68 = auVar116._0_32_;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uVar63;
            auVar67 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar45));
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar50;
            auVar106 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar44));
            lVar47 = 0;
            for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
              lVar47 = lVar47 + 1;
            }
            uVar49 = uVar49 - 1 & uVar49;
            uVar63 = (ulong)uVar49;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = *(ulong *)(uVar48 + lVar47 * 8);
            auVar5 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_2820 + lVar47 * 4)));
            auVar4 = vpcmpgtd_avx(auVar106,auVar67);
            if (uVar49 != 0) {
              lVar47 = 0;
              for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                lVar47 = lVar47 + 1;
              }
              uVar49 = uVar49 - 1 & uVar49;
              uVar50 = (ulong)uVar49;
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)(uVar48 + lVar47 * 8);
              auVar6 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_2820 + lVar47 * 4)));
              uVar59 = local_2a18;
              uVar60 = local_2a20;
              uVar61 = local_2a28;
              uVar62 = local_2a38;
              uVar64 = local_2a30;
              if (uVar49 == 0) {
                auVar7 = vpshufd_avx(auVar4,0xaa);
                auVar4 = vblendvps_avx(auVar106,auVar67,auVar7);
                auVar67 = vblendvps_avx(auVar67,auVar106,auVar7);
                auVar106 = vpcmpgtd_avx(auVar6,auVar5);
                auVar7 = vpshufd_avx(auVar106,0xaa);
                auVar106 = vblendvps_avx(auVar6,auVar5,auVar7);
                auVar5 = vblendvps_avx(auVar5,auVar6,auVar7);
                auVar6 = vpcmpgtd_avx(auVar5,auVar67);
                auVar7 = vpshufd_avx(auVar6,0xaa);
                auVar6 = vblendvps_avx(auVar5,auVar67,auVar7);
                auVar67 = vblendvps_avx(auVar67,auVar5,auVar7);
                auVar5 = vpcmpgtd_avx(auVar106,auVar4);
                auVar7 = vpshufd_avx(auVar5,0xaa);
                auVar5 = vblendvps_avx(auVar106,auVar4,auVar7);
                auVar106 = vblendvps_avx(auVar4,auVar106,auVar7);
                auVar4 = vpcmpgtd_avx(auVar6,auVar106);
                auVar7 = vpshufd_avx(auVar4,0xaa);
                auVar4 = vblendvps_avx(auVar6,auVar106,auVar7);
                auVar106 = vblendvps_avx(auVar106,auVar6,auVar7);
                *pauVar46 = auVar67;
                pauVar46[1] = auVar106;
                pauVar46[2] = auVar4;
                uVar63 = auVar5._0_8_;
                pauVar56 = pauVar46 + 3;
              }
              else {
                *pauVar46 = auVar67;
                pauVar46[1] = auVar106;
                pauVar46[2] = auVar5;
                pauVar46[3] = auVar6;
                lVar47 = 0x30;
                do {
                  lVar52 = lVar47;
                  lVar47 = 0;
                  for (uVar63 = uVar50; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000
                      ) {
                    lVar47 = lVar47 + 1;
                  }
                  uVar63 = *(ulong *)(uVar48 + lVar47 * 8);
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = uVar63;
                  auVar67 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_2820 + lVar47 * 4)));
                  *(undefined1 (*) [16])(pauVar46[1] + lVar52) = auVar67;
                  uVar50 = uVar50 - 1 & uVar50;
                  lVar47 = lVar52 + 0x10;
                } while (uVar50 != 0);
                pauVar56 = (undefined1 (*) [16])(pauVar46[1] + lVar52);
                if (lVar52 + 0x10 == 0) {
                  auVar126 = ZEXT3264(local_2920);
                  auVar132 = ZEXT3264(local_2940);
                  auVar116 = ZEXT3264(auVar68);
                  pauVar46 = pauVar56;
                  goto joined_r0x005fd9a3;
                }
                lVar47 = 0x10;
                pauVar51 = pauVar46;
                do {
                  auVar67 = pauVar51[1];
                  pauVar51 = pauVar51 + 1;
                  uVar49 = vextractps_avx(auVar67,2);
                  lVar52 = lVar47;
                  do {
                    if (uVar49 <= *(uint *)(pauVar46[-1] + lVar52 + 8)) {
                      pauVar53 = (undefined1 (*) [16])(*pauVar46 + lVar52);
                      break;
                    }
                    *(undefined1 (*) [16])(*pauVar46 + lVar52) =
                         *(undefined1 (*) [16])(pauVar46[-1] + lVar52);
                    lVar52 = lVar52 + -0x10;
                    pauVar53 = pauVar46;
                  } while (lVar52 != 0);
                  *pauVar53 = auVar67;
                  lVar47 = lVar47 + 0x10;
                } while (pauVar56 != pauVar51);
                uVar63 = *(ulong *)*pauVar56;
              }
              auVar126 = ZEXT3264(local_2920);
              auVar132 = ZEXT3264(local_2940);
              auVar116 = ZEXT3264(auVar68);
              pauVar46 = pauVar56;
              goto joined_r0x005fd9a3;
            }
            auVar6 = vpshufd_avx(auVar4,0xaa);
            auVar4 = vblendvps_avx(auVar106,auVar67,auVar6);
            auVar67 = vblendvps_avx(auVar67,auVar106,auVar6);
            auVar106 = vpcmpgtd_avx(auVar5,auVar4);
            auVar6 = vpshufd_avx(auVar106,0xaa);
            auVar106 = vblendvps_avx(auVar5,auVar4,auVar6);
            auVar4 = vblendvps_avx(auVar4,auVar5,auVar6);
            auVar5 = vpcmpgtd_avx(auVar4,auVar67);
            auVar6 = vpshufd_avx(auVar5,0xaa);
            auVar5 = vblendvps_avx(auVar4,auVar67,auVar6);
            auVar67 = vblendvps_avx(auVar67,auVar4,auVar6);
            *pauVar46 = auVar67;
            pauVar46[1] = auVar5;
            uVar63 = auVar106._0_8_;
            auVar116 = ZEXT3264(auVar68);
            pauVar46 = pauVar46 + 2;
          }
        }
        goto joined_r0x005fd9a3;
      }
      local_29a0 = (ulong)((uint)uVar63 & 0xf) - 8;
      if (local_29a0 != 0) {
        uVar63 = uVar63 & 0xfffffffffffffff0;
        local_2998 = 0;
        local_2520 = auVar171._0_32_;
        local_2a40 = pauVar46;
        do {
          lVar47 = local_2998 * 0x90;
          uVar1 = *(undefined4 *)(uVar63 + 0x70 + lVar47);
          auVar89._4_4_ = uVar1;
          auVar89._0_4_ = uVar1;
          auVar89._8_4_ = uVar1;
          auVar89._12_4_ = uVar1;
          auVar89._16_4_ = uVar1;
          auVar89._20_4_ = uVar1;
          auVar89._24_4_ = uVar1;
          auVar89._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar63 + 0x7c + lVar47);
          auVar107._4_4_ = uVar1;
          auVar107._0_4_ = uVar1;
          auVar107._8_4_ = uVar1;
          auVar107._12_4_ = uVar1;
          auVar107._16_4_ = uVar1;
          auVar107._20_4_ = uVar1;
          auVar107._24_4_ = uVar1;
          auVar107._28_4_ = uVar1;
          local_2990 = lVar47 + uVar63;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(local_29a8 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar67);
          auVar68 = vcvtdq2ps_avx(auVar68);
          auVar117 = vfmadd213ps_fma(auVar68,auVar107,auVar89);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(local_29b0 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar106);
          auVar68 = vcvtdq2ps_avx(auVar68);
          uVar1 = *(undefined4 *)(uVar63 + 0x74 + lVar47);
          auVar110._4_4_ = uVar1;
          auVar110._0_4_ = uVar1;
          auVar110._8_4_ = uVar1;
          auVar110._12_4_ = uVar1;
          auVar110._16_4_ = uVar1;
          auVar110._20_4_ = uVar1;
          auVar110._24_4_ = uVar1;
          auVar110._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar63 + 0x80 + lVar47);
          auVar119._4_4_ = uVar1;
          auVar119._0_4_ = uVar1;
          auVar119._8_4_ = uVar1;
          auVar119._12_4_ = uVar1;
          auVar119._16_4_ = uVar1;
          auVar119._20_4_ = uVar1;
          auVar119._24_4_ = uVar1;
          auVar119._28_4_ = uVar1;
          auVar118 = vfmadd213ps_fma(auVar68,auVar107,auVar89);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_29b8 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar4);
          auVar68 = vcvtdq2ps_avx(auVar68);
          auVar4 = vfmadd213ps_fma(auVar68,auVar119,auVar110);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_29c0 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar5);
          auVar68 = vcvtdq2ps_avx(auVar68);
          uVar1 = *(undefined4 *)(uVar63 + 0x78 + lVar47);
          auVar128._4_4_ = uVar1;
          auVar128._0_4_ = uVar1;
          auVar128._8_4_ = uVar1;
          auVar128._12_4_ = uVar1;
          auVar128._16_4_ = uVar1;
          auVar128._20_4_ = uVar1;
          auVar128._24_4_ = uVar1;
          auVar128._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar63 + 0x84 + lVar47);
          auVar134._4_4_ = uVar1;
          auVar134._0_4_ = uVar1;
          auVar134._8_4_ = uVar1;
          auVar134._12_4_ = uVar1;
          auVar134._16_4_ = uVar1;
          auVar134._20_4_ = uVar1;
          auVar134._24_4_ = uVar1;
          auVar134._28_4_ = uVar1;
          auVar5 = vfmadd213ps_fma(auVar68,auVar119,auVar110);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_29c8 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar6);
          auVar68 = vcvtdq2ps_avx(auVar68);
          auVar6 = vfmadd213ps_fma(auVar68,auVar134,auVar128);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_29d0 + 0x40 + local_2990);
          auVar68 = vpmovzxbd_avx2(auVar7);
          auVar68 = vcvtdq2ps_avx(auVar68);
          auVar7 = vfmadd213ps_fma(auVar68,auVar134,auVar128);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = *(ulong *)(uVar63 + 0x40 + lVar47);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)(uVar63 + 0x48 + lVar47);
          auVar67 = vpminub_avx(auVar127,auVar133);
          auVar106 = vpcmpeqb_avx(auVar127,auVar67);
          auVar68 = vsubps_avx(ZEXT1632(auVar117),local_2920);
          auVar12._4_4_ = fVar96 * auVar68._4_4_;
          auVar12._0_4_ = fVar94 * auVar68._0_4_;
          auVar12._8_4_ = fVar98 * auVar68._8_4_;
          auVar12._12_4_ = fVar100 * auVar68._12_4_;
          auVar12._16_4_ = fVar102 * auVar68._16_4_;
          auVar12._20_4_ = fVar140 * auVar68._20_4_;
          auVar12._24_4_ = fVar95 * auVar68._24_4_;
          auVar12._28_4_ = auVar68._28_4_;
          auVar68 = vsubps_avx(ZEXT1632(auVar4),local_2940);
          auVar13._4_4_ = auVar68._4_4_ * fStack_283c;
          auVar13._0_4_ = auVar68._0_4_ * local_2840;
          auVar13._8_4_ = auVar68._8_4_ * fStack_2838;
          auVar13._12_4_ = auVar68._12_4_ * fStack_2834;
          auVar13._16_4_ = auVar68._16_4_ * fStack_2830;
          auVar13._20_4_ = auVar68._20_4_ * fStack_282c;
          auVar13._24_4_ = auVar68._24_4_ * fStack_2828;
          auVar13._28_4_ = auVar68._28_4_;
          auVar68 = vmaxps_avx(auVar12,auVar13);
          auVar88 = vsubps_avx(ZEXT1632(auVar118),local_2920);
          auVar72._4_4_ = auVar88._4_4_ * (float)local_2860._4_4_;
          auVar72._0_4_ = auVar88._0_4_ * (float)local_2860._0_4_;
          auVar72._8_4_ = auVar88._8_4_ * fStack_2858;
          auVar72._12_4_ = auVar88._12_4_ * fStack_2854;
          auVar72._16_4_ = auVar88._16_4_ * fStack_2850;
          auVar72._20_4_ = auVar88._20_4_ * fStack_284c;
          auVar72._24_4_ = auVar88._24_4_ * fStack_2848;
          auVar72._28_4_ = auVar88._28_4_;
          auVar88 = vsubps_avx(ZEXT1632(auVar5),local_2940);
          auVar14._4_4_ = fVar83 * auVar88._4_4_;
          auVar14._0_4_ = fVar82 * auVar88._0_4_;
          auVar14._8_4_ = fVar84 * auVar88._8_4_;
          auVar14._12_4_ = fVar141 * auVar88._12_4_;
          auVar14._16_4_ = fVar146 * auVar88._16_4_;
          auVar14._20_4_ = fVar147 * auVar88._20_4_;
          auVar14._24_4_ = fVar86 * auVar88._24_4_;
          auVar14._28_4_ = auVar88._28_4_;
          auVar12 = vminps_avx(auVar72,auVar14);
          auVar88 = vsubps_avx(ZEXT1632(auVar6),auVar145._0_32_);
          auVar15._4_4_ = fVar156 * auVar88._4_4_;
          auVar15._0_4_ = fVar152 * auVar88._0_4_;
          auVar15._8_4_ = fVar158 * auVar88._8_4_;
          auVar15._12_4_ = fVar160 * auVar88._12_4_;
          auVar15._16_4_ = fVar162 * auVar88._16_4_;
          auVar15._20_4_ = fVar164 * auVar88._20_4_;
          auVar15._24_4_ = fVar97 * auVar88._24_4_;
          auVar15._28_4_ = auVar88._28_4_;
          auVar88 = vmaxps_avx(auVar15,auVar170._0_32_);
          local_23c0 = vmaxps_avx(auVar68,auVar88);
          auVar68 = vsubps_avx(ZEXT1632(auVar7),auVar145._0_32_);
          auVar16._4_4_ = fVar149 * auVar68._4_4_;
          auVar16._0_4_ = fVar148 * auVar68._0_4_;
          auVar16._8_4_ = fVar150 * auVar68._8_4_;
          auVar16._12_4_ = fVar151 * auVar68._12_4_;
          auVar16._16_4_ = fVar153 * auVar68._16_4_;
          auVar16._20_4_ = fVar157 * auVar68._20_4_;
          auVar16._24_4_ = fVar93 * auVar68._24_4_;
          auVar16._28_4_ = auVar68._28_4_;
          auVar68 = vminps_avx(auVar16,auVar171._0_32_);
          auVar68 = vminps_avx(auVar12,auVar68);
          auVar68 = vcmpps_avx(local_23c0,auVar68,2);
          auVar67 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
          auVar106 = vpmovzxbw_avx(auVar106);
          auVar67 = vpand_avx(auVar67,auVar106);
          auVar67 = vpshufb_avx(auVar67,_DAT_01fed3c0);
          bVar17 = SUB161(auVar67 >> 7,0) & 1 | (SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar67 >> 0x17,0) & 1) << 2 | (SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar67 >> 0x27,0) & 1) << 4 | (SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar67 >> 0x37,0) & 1) << 6 | SUB161(auVar67 >> 0x3f,0) << 7;
          if (bVar17 != 0) {
            local_2978 = (ulong)bVar17;
            do {
              lVar47 = 0;
              for (uVar48 = local_2978; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000
                  ) {
                lVar47 = lVar47 + 1;
              }
              fVar103 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)(local_23c0 + lVar47 * 4) <= fVar103) {
                uVar8 = *(ushort *)(local_2990 + lVar47 * 8);
                uVar9 = *(ushort *)(local_2990 + 2 + lVar47 * 8);
                local_28e0._4_4_ = *(uint *)(local_2990 + 0x88);
                uVar49 = *(uint *)(local_2990 + 4 + lVar47 * 8);
                local_2a08 = (ulong)uVar49;
                local_2980 = context->scene;
                pGVar10 = (local_2980->geometries).items[(uint)local_28e0._4_4_].ptr;
                local_2988 = *(long *)&pGVar10->field_0x58;
                lVar58 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * local_2a08;
                local_2a0c = uVar8 & 0x7fff;
                local_2a10 = uVar9 & 0x7fff;
                uVar45 = *(uint *)(local_2988 + 4 + lVar58);
                uVar61 = (ulong)uVar45;
                uVar60 = (ulong)(uVar45 * local_2a10 + *(int *)(local_2988 + lVar58) + local_2a0c);
                lVar47 = *(long *)&pGVar10[1].time_range.upper;
                p_Var11 = pGVar10[1].intersectionFilterN;
                auVar67 = *(undefined1 (*) [16])(lVar47 + (uVar60 + 1) * (long)p_Var11);
                auVar106 = *(undefined1 (*) [16])(lVar47 + (uVar60 + uVar61) * (long)p_Var11);
                lVar52 = uVar60 + uVar61 + 1;
                auVar4 = *(undefined1 (*) [16])(lVar47 + lVar52 * (long)p_Var11);
                auVar5 = *(undefined1 (*) [16])
                          (lVar47 + (uVar60 + (-1 < (short)uVar8) + 1) * (long)p_Var11);
                lVar54 = (ulong)(-1 < (short)uVar8) + lVar52;
                uVar59 = 0;
                if (-1 < (short)uVar9) {
                  uVar59 = uVar61;
                }
                auVar6 = *(undefined1 (*) [16])(lVar47 + lVar54 * (long)p_Var11);
                auVar7 = *(undefined1 (*) [16])(lVar47 + (uVar60 + uVar61 + uVar59) * (long)p_Var11)
                ;
                auVar117 = *(undefined1 (*) [16])(lVar47 + (lVar52 + uVar59) * (long)p_Var11);
                auVar137._16_16_ =
                     *(undefined1 (*) [16])(lVar47 + (uVar59 + lVar54) * (long)p_Var11);
                auVar137._0_16_ = auVar4;
                auVar127 = vunpcklps_avx(auVar67,auVar6);
                auVar118 = vunpckhps_avx(auVar67,auVar6);
                auVar133 = vunpcklps_avx(auVar5,auVar4);
                auVar5 = vunpckhps_avx(auVar5,auVar4);
                auVar105 = vunpcklps_avx(auVar118,auVar5);
                auVar76 = vunpcklps_avx(auVar127,auVar133);
                auVar5 = vunpckhps_avx(auVar127,auVar133);
                auVar127 = vunpcklps_avx(auVar106,auVar117);
                auVar118 = vunpckhps_avx(auVar106,auVar117);
                auVar133 = vunpcklps_avx(auVar4,auVar7);
                auVar7 = vunpckhps_avx(auVar4,auVar7);
                auVar118 = vunpcklps_avx(auVar118,auVar7);
                auVar65 = vunpcklps_avx(auVar127,auVar133);
                auVar7 = vunpckhps_avx(auVar127,auVar133);
                auVar90._16_16_ = auVar117;
                auVar90._0_16_ = auVar106;
                auVar77._16_16_ = auVar6;
                auVar77._0_16_ = auVar67;
                auVar68 = vunpcklps_avx(auVar77,auVar90);
                auVar69._16_16_ = auVar4;
                auVar69._0_16_ = *(undefined1 (*) [16])(lVar47 + (long)p_Var11 * uVar60);
                auVar88 = vunpcklps_avx(auVar69,auVar137);
                auVar16 = vunpcklps_avx(auVar88,auVar68);
                auVar68 = vunpckhps_avx(auVar88,auVar68);
                auVar88 = vunpckhps_avx(auVar77,auVar90);
                auVar12 = vunpckhps_avx(auVar69,auVar137);
                auVar88 = vunpcklps_avx(auVar12,auVar88);
                auVar78._16_16_ = auVar76;
                auVar78._0_16_ = auVar76;
                auVar111._16_16_ = auVar5;
                auVar111._0_16_ = auVar5;
                auVar120._16_16_ = auVar105;
                auVar120._0_16_ = auVar105;
                auVar138._16_16_ = auVar65;
                auVar138._0_16_ = auVar65;
                auVar142._16_16_ = auVar7;
                auVar142._0_16_ = auVar7;
                uVar1 = *(undefined4 *)(ray + k * 4);
                auVar154._4_4_ = uVar1;
                auVar154._0_4_ = uVar1;
                auVar154._8_4_ = uVar1;
                auVar154._12_4_ = uVar1;
                auVar154._16_4_ = uVar1;
                auVar154._20_4_ = uVar1;
                auVar154._24_4_ = uVar1;
                auVar154._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
                auVar167._4_4_ = uVar1;
                auVar167._0_4_ = uVar1;
                auVar167._8_4_ = uVar1;
                auVar167._12_4_ = uVar1;
                auVar167._16_4_ = uVar1;
                auVar167._20_4_ = uVar1;
                auVar167._24_4_ = uVar1;
                auVar167._28_4_ = uVar1;
                auVar129._16_16_ = auVar118;
                auVar129._0_16_ = auVar118;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
                auVar168._4_4_ = uVar1;
                auVar168._0_4_ = uVar1;
                auVar168._8_4_ = uVar1;
                auVar168._12_4_ = uVar1;
                auVar168._16_4_ = uVar1;
                auVar168._20_4_ = uVar1;
                auVar168._24_4_ = uVar1;
                auVar168._28_4_ = uVar1;
                auVar13 = vsubps_avx(auVar16,auVar154);
                local_23e0 = vsubps_avx(auVar68,auVar167);
                local_2400 = vsubps_avx(auVar88,auVar168);
                auVar68 = vsubps_avx(auVar78,auVar154);
                auVar88 = vsubps_avx(auVar111,auVar167);
                auVar12 = vsubps_avx(auVar120,auVar168);
                auVar72 = vsubps_avx(auVar138,auVar154);
                auVar14 = vsubps_avx(auVar142,auVar167);
                auVar15 = vsubps_avx(auVar129,auVar168);
                local_2420 = vsubps_avx(auVar72,auVar13);
                local_2460 = vsubps_avx(auVar14,local_23e0);
                local_2440 = vsubps_avx(auVar15,local_2400);
                auVar70._0_4_ = auVar13._0_4_ + auVar72._0_4_;
                auVar70._4_4_ = auVar13._4_4_ + auVar72._4_4_;
                auVar70._8_4_ = auVar13._8_4_ + auVar72._8_4_;
                auVar70._12_4_ = auVar13._12_4_ + auVar72._12_4_;
                auVar70._16_4_ = auVar13._16_4_ + auVar72._16_4_;
                auVar70._20_4_ = auVar13._20_4_ + auVar72._20_4_;
                auVar70._24_4_ = auVar13._24_4_ + auVar72._24_4_;
                fVar83 = auVar13._28_4_;
                auVar70._28_4_ = fVar83 + auVar72._28_4_;
                auVar108._0_4_ = auVar14._0_4_ + local_23e0._0_4_;
                auVar108._4_4_ = auVar14._4_4_ + local_23e0._4_4_;
                auVar108._8_4_ = auVar14._8_4_ + local_23e0._8_4_;
                auVar108._12_4_ = auVar14._12_4_ + local_23e0._12_4_;
                auVar108._16_4_ = auVar14._16_4_ + local_23e0._16_4_;
                auVar108._20_4_ = auVar14._20_4_ + local_23e0._20_4_;
                auVar108._24_4_ = auVar14._24_4_ + local_23e0._24_4_;
                auVar108._28_4_ = auVar14._28_4_ + local_23e0._28_4_;
                fVar86 = local_2400._0_4_;
                auVar130._0_4_ = auVar15._0_4_ + fVar86;
                fVar93 = local_2400._4_4_;
                auVar130._4_4_ = auVar15._4_4_ + fVar93;
                fVar95 = local_2400._8_4_;
                auVar130._8_4_ = auVar15._8_4_ + fVar95;
                fVar97 = local_2400._12_4_;
                auVar130._12_4_ = auVar15._12_4_ + fVar97;
                fVar99 = local_2400._16_4_;
                auVar130._16_4_ = auVar15._16_4_ + fVar99;
                fVar101 = local_2400._20_4_;
                auVar130._20_4_ = auVar15._20_4_ + fVar101;
                fVar104 = local_2400._24_4_;
                auVar130._24_4_ = auVar15._24_4_ + fVar104;
                fVar85 = local_2400._28_4_;
                auVar130._28_4_ = auVar15._28_4_ + fVar85;
                auVar24._4_4_ = local_2440._4_4_ * auVar108._4_4_;
                auVar24._0_4_ = local_2440._0_4_ * auVar108._0_4_;
                auVar24._8_4_ = local_2440._8_4_ * auVar108._8_4_;
                auVar24._12_4_ = local_2440._12_4_ * auVar108._12_4_;
                auVar24._16_4_ = local_2440._16_4_ * auVar108._16_4_;
                auVar24._20_4_ = local_2440._20_4_ * auVar108._20_4_;
                auVar24._24_4_ = local_2440._24_4_ * auVar108._24_4_;
                auVar24._28_4_ = auVar16._28_4_;
                auVar106 = vfmsub231ps_fma(auVar24,local_2460,auVar130);
                auVar25._4_4_ = local_2420._4_4_ * auVar130._4_4_;
                auVar25._0_4_ = local_2420._0_4_ * auVar130._0_4_;
                auVar25._8_4_ = local_2420._8_4_ * auVar130._8_4_;
                auVar25._12_4_ = local_2420._12_4_ * auVar130._12_4_;
                auVar25._16_4_ = local_2420._16_4_ * auVar130._16_4_;
                auVar25._20_4_ = local_2420._20_4_ * auVar130._20_4_;
                auVar25._24_4_ = local_2420._24_4_ * auVar130._24_4_;
                auVar25._28_4_ = auVar130._28_4_;
                auVar67 = vfmsub231ps_fma(auVar25,local_2440,auVar70);
                auVar26._4_4_ = local_2460._4_4_ * auVar70._4_4_;
                auVar26._0_4_ = local_2460._0_4_ * auVar70._0_4_;
                auVar26._8_4_ = local_2460._8_4_ * auVar70._8_4_;
                auVar26._12_4_ = local_2460._12_4_ * auVar70._12_4_;
                auVar26._16_4_ = local_2460._16_4_ * auVar70._16_4_;
                auVar26._20_4_ = local_2460._20_4_ * auVar70._20_4_;
                auVar26._24_4_ = local_2460._24_4_ * auVar70._24_4_;
                auVar26._28_4_ = auVar70._28_4_;
                auVar4 = vfmsub231ps_fma(auVar26,local_2420,auVar108);
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
                auVar112._4_4_ = uVar1;
                auVar112._0_4_ = uVar1;
                auVar112._8_4_ = uVar1;
                auVar112._12_4_ = uVar1;
                auVar112._16_4_ = uVar1;
                auVar112._20_4_ = uVar1;
                auVar112._24_4_ = uVar1;
                auVar112._28_4_ = uVar1;
                local_2900._4_4_ = *(float *)(ray + k * 4 + 0x60);
                auVar27._4_4_ = local_2900._4_4_ * auVar4._4_4_;
                auVar27._0_4_ = local_2900._4_4_ * auVar4._0_4_;
                auVar27._8_4_ = local_2900._4_4_ * auVar4._8_4_;
                auVar27._12_4_ = local_2900._4_4_ * auVar4._12_4_;
                auVar27._16_4_ = local_2900._4_4_ * 0.0;
                auVar27._20_4_ = local_2900._4_4_ * 0.0;
                auVar27._24_4_ = local_2900._4_4_ * 0.0;
                auVar27._28_4_ = auVar108._28_4_;
                auVar67 = vfmadd231ps_fma(auVar27,auVar112,ZEXT1632(auVar67));
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
                auVar169._4_4_ = uVar1;
                auVar169._0_4_ = uVar1;
                auVar169._8_4_ = uVar1;
                auVar169._12_4_ = uVar1;
                auVar169._16_4_ = uVar1;
                auVar169._20_4_ = uVar1;
                auVar169._24_4_ = uVar1;
                auVar169._28_4_ = uVar1;
                auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar169,ZEXT1632(auVar106));
                local_2480 = vsubps_avx(local_23e0,auVar88);
                local_24a0 = vsubps_avx(local_2400,auVar12);
                auVar131._0_4_ = local_23e0._0_4_ + auVar88._0_4_;
                auVar131._4_4_ = local_23e0._4_4_ + auVar88._4_4_;
                auVar131._8_4_ = local_23e0._8_4_ + auVar88._8_4_;
                auVar131._12_4_ = local_23e0._12_4_ + auVar88._12_4_;
                auVar131._16_4_ = local_23e0._16_4_ + auVar88._16_4_;
                auVar131._20_4_ = local_23e0._20_4_ + auVar88._20_4_;
                auVar131._24_4_ = local_23e0._24_4_ + auVar88._24_4_;
                fVar74 = auVar88._28_4_;
                auVar131._28_4_ = local_23e0._28_4_ + fVar74;
                auVar135._0_4_ = auVar12._0_4_ + fVar86;
                auVar135._4_4_ = auVar12._4_4_ + fVar93;
                auVar135._8_4_ = auVar12._8_4_ + fVar95;
                auVar135._12_4_ = auVar12._12_4_ + fVar97;
                auVar135._16_4_ = auVar12._16_4_ + fVar99;
                auVar135._20_4_ = auVar12._20_4_ + fVar101;
                auVar135._24_4_ = auVar12._24_4_ + fVar104;
                fVar82 = auVar12._28_4_;
                auVar135._28_4_ = fVar82 + fVar85;
                fVar141 = local_24a0._0_4_;
                fVar146 = local_24a0._4_4_;
                auVar28._4_4_ = fVar146 * auVar131._4_4_;
                auVar28._0_4_ = fVar141 * auVar131._0_4_;
                fVar147 = local_24a0._8_4_;
                auVar28._8_4_ = fVar147 * auVar131._8_4_;
                fVar148 = local_24a0._12_4_;
                auVar28._12_4_ = fVar148 * auVar131._12_4_;
                fVar149 = local_24a0._16_4_;
                auVar28._16_4_ = fVar149 * auVar131._16_4_;
                fVar150 = local_24a0._20_4_;
                auVar28._20_4_ = fVar150 * auVar131._20_4_;
                fVar151 = local_24a0._24_4_;
                auVar28._24_4_ = fVar151 * auVar131._24_4_;
                auVar28._28_4_ = fVar85;
                auVar4 = vfmsub231ps_fma(auVar28,local_2480,auVar135);
                local_24c0 = vsubps_avx(auVar13,auVar68);
                fVar85 = local_24c0._0_4_;
                fVar94 = local_24c0._4_4_;
                auVar29._4_4_ = auVar135._4_4_ * fVar94;
                auVar29._0_4_ = auVar135._0_4_ * fVar85;
                fVar98 = local_24c0._8_4_;
                auVar29._8_4_ = auVar135._8_4_ * fVar98;
                fVar102 = local_24c0._12_4_;
                auVar29._12_4_ = auVar135._12_4_ * fVar102;
                fVar152 = local_24c0._16_4_;
                auVar29._16_4_ = auVar135._16_4_ * fVar152;
                fVar158 = local_24c0._20_4_;
                auVar29._20_4_ = auVar135._20_4_ * fVar158;
                fVar162 = local_24c0._24_4_;
                auVar29._24_4_ = auVar135._24_4_ * fVar162;
                auVar29._28_4_ = fVar82;
                auVar136._0_4_ = auVar13._0_4_ + auVar68._0_4_;
                auVar136._4_4_ = auVar13._4_4_ + auVar68._4_4_;
                auVar136._8_4_ = auVar13._8_4_ + auVar68._8_4_;
                auVar136._12_4_ = auVar13._12_4_ + auVar68._12_4_;
                auVar136._16_4_ = auVar13._16_4_ + auVar68._16_4_;
                auVar136._20_4_ = auVar13._20_4_ + auVar68._20_4_;
                auVar136._24_4_ = auVar13._24_4_ + auVar68._24_4_;
                auVar136._28_4_ = fVar83 + auVar68._28_4_;
                auVar106 = vfmsub231ps_fma(auVar29,local_24a0,auVar136);
                fVar92 = local_2480._0_4_;
                fVar96 = local_2480._4_4_;
                auVar30._4_4_ = auVar136._4_4_ * fVar96;
                auVar30._0_4_ = auVar136._0_4_ * fVar92;
                fVar100 = local_2480._8_4_;
                auVar30._8_4_ = auVar136._8_4_ * fVar100;
                fVar140 = local_2480._12_4_;
                auVar30._12_4_ = auVar136._12_4_ * fVar140;
                fVar156 = local_2480._16_4_;
                auVar30._16_4_ = auVar136._16_4_ * fVar156;
                fVar160 = local_2480._20_4_;
                auVar30._20_4_ = auVar136._20_4_ * fVar160;
                fVar164 = local_2480._24_4_;
                auVar30._24_4_ = auVar136._24_4_ * fVar164;
                auVar30._28_4_ = auVar136._28_4_;
                auVar5 = vfmsub231ps_fma(auVar30,local_24c0,auVar131);
                auVar31._4_4_ = local_2900._4_4_ * auVar5._4_4_;
                auVar31._0_4_ = local_2900._4_4_ * auVar5._0_4_;
                auVar31._8_4_ = local_2900._4_4_ * auVar5._8_4_;
                auVar31._12_4_ = local_2900._4_4_ * auVar5._12_4_;
                auVar31._16_4_ = local_2900._4_4_ * 0.0;
                auVar31._20_4_ = local_2900._4_4_ * 0.0;
                auVar31._24_4_ = local_2900._4_4_ * 0.0;
                auVar31._28_4_ = fVar83;
                auVar106 = vfmadd231ps_fma(auVar31,auVar112,ZEXT1632(auVar106));
                auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar169,ZEXT1632(auVar4));
                auVar16 = vsubps_avx(auVar68,auVar72);
                auVar121._0_4_ = auVar68._0_4_ + auVar72._0_4_;
                auVar121._4_4_ = auVar68._4_4_ + auVar72._4_4_;
                auVar121._8_4_ = auVar68._8_4_ + auVar72._8_4_;
                auVar121._12_4_ = auVar68._12_4_ + auVar72._12_4_;
                auVar121._16_4_ = auVar68._16_4_ + auVar72._16_4_;
                auVar121._20_4_ = auVar68._20_4_ + auVar72._20_4_;
                auVar121._24_4_ = auVar68._24_4_ + auVar72._24_4_;
                auVar121._28_4_ = auVar68._28_4_ + auVar72._28_4_;
                auVar72 = vsubps_avx(auVar88,auVar14);
                auVar139._0_4_ = auVar14._0_4_ + auVar88._0_4_;
                auVar139._4_4_ = auVar14._4_4_ + auVar88._4_4_;
                auVar139._8_4_ = auVar14._8_4_ + auVar88._8_4_;
                auVar139._12_4_ = auVar14._12_4_ + auVar88._12_4_;
                auVar139._16_4_ = auVar14._16_4_ + auVar88._16_4_;
                auVar139._20_4_ = auVar14._20_4_ + auVar88._20_4_;
                auVar139._24_4_ = auVar14._24_4_ + auVar88._24_4_;
                auVar139._28_4_ = auVar14._28_4_ + fVar74;
                auVar14 = vsubps_avx(auVar12,auVar15);
                auVar79._0_4_ = auVar12._0_4_ + auVar15._0_4_;
                auVar79._4_4_ = auVar12._4_4_ + auVar15._4_4_;
                auVar79._8_4_ = auVar12._8_4_ + auVar15._8_4_;
                auVar79._12_4_ = auVar12._12_4_ + auVar15._12_4_;
                auVar79._16_4_ = auVar12._16_4_ + auVar15._16_4_;
                auVar79._20_4_ = auVar12._20_4_ + auVar15._20_4_;
                auVar79._24_4_ = auVar12._24_4_ + auVar15._24_4_;
                auVar79._28_4_ = fVar82 + auVar15._28_4_;
                auVar32._4_4_ = auVar139._4_4_ * auVar14._4_4_;
                auVar32._0_4_ = auVar139._0_4_ * auVar14._0_4_;
                auVar32._8_4_ = auVar139._8_4_ * auVar14._8_4_;
                auVar32._12_4_ = auVar139._12_4_ * auVar14._12_4_;
                auVar32._16_4_ = auVar139._16_4_ * auVar14._16_4_;
                auVar32._20_4_ = auVar139._20_4_ * auVar14._20_4_;
                auVar32._24_4_ = auVar139._24_4_ * auVar14._24_4_;
                auVar32._28_4_ = fVar74;
                auVar5 = vfmsub231ps_fma(auVar32,auVar72,auVar79);
                auVar33._4_4_ = auVar79._4_4_ * auVar16._4_4_;
                auVar33._0_4_ = auVar79._0_4_ * auVar16._0_4_;
                auVar33._8_4_ = auVar79._8_4_ * auVar16._8_4_;
                auVar33._12_4_ = auVar79._12_4_ * auVar16._12_4_;
                auVar33._16_4_ = auVar79._16_4_ * auVar16._16_4_;
                auVar33._20_4_ = auVar79._20_4_ * auVar16._20_4_;
                auVar33._24_4_ = auVar79._24_4_ * auVar16._24_4_;
                auVar33._28_4_ = auVar79._28_4_;
                auVar4 = vfmsub231ps_fma(auVar33,auVar14,auVar121);
                auVar34._4_4_ = auVar121._4_4_ * auVar72._4_4_;
                auVar34._0_4_ = auVar121._0_4_ * auVar72._0_4_;
                auVar34._8_4_ = auVar121._8_4_ * auVar72._8_4_;
                auVar34._12_4_ = auVar121._12_4_ * auVar72._12_4_;
                auVar34._16_4_ = auVar121._16_4_ * auVar72._16_4_;
                auVar34._20_4_ = auVar121._20_4_ * auVar72._20_4_;
                auVar34._24_4_ = auVar121._24_4_ * auVar72._24_4_;
                auVar34._28_4_ = auVar121._28_4_;
                auVar6 = vfmsub231ps_fma(auVar34,auVar16,auVar139);
                local_2900._0_4_ = local_2900._4_4_;
                uStack_28f8._0_4_ = local_2900._4_4_;
                uStack_28f8._4_4_ = local_2900._4_4_;
                fStack_28f0 = local_2900._4_4_;
                fStack_28ec = local_2900._4_4_;
                fStack_28e8 = local_2900._4_4_;
                fStack_28e4 = local_2900._4_4_;
                auVar15 = _local_2900;
                auVar122._0_4_ = local_2900._4_4_ * auVar6._0_4_;
                auVar122._4_4_ = local_2900._4_4_ * auVar6._4_4_;
                auVar122._8_4_ = local_2900._4_4_ * auVar6._8_4_;
                auVar122._12_4_ = local_2900._4_4_ * auVar6._12_4_;
                auVar122._16_4_ = local_2900._4_4_ * 0.0;
                auVar122._20_4_ = local_2900._4_4_ * 0.0;
                auVar122._24_4_ = local_2900._4_4_ * 0.0;
                auVar122._28_4_ = 0;
                auVar4 = vfmadd231ps_fma(auVar122,auVar112,ZEXT1632(auVar4));
                auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar169,ZEXT1632(auVar5));
                fVar74 = auVar4._0_4_ + auVar106._0_4_ + auVar67._0_4_;
                fVar82 = auVar4._4_4_ + auVar106._4_4_ + auVar67._4_4_;
                fVar83 = auVar4._8_4_ + auVar106._8_4_ + auVar67._8_4_;
                fVar84 = auVar4._12_4_ + auVar106._12_4_ + auVar67._12_4_;
                local_24e0 = ZEXT1632(CONCAT412(fVar84,CONCAT48(fVar83,CONCAT44(fVar82,fVar74))));
                auVar113._8_4_ = 0x7fffffff;
                auVar113._0_8_ = 0x7fffffff7fffffff;
                auVar113._12_4_ = 0x7fffffff;
                auVar113._16_4_ = 0x7fffffff;
                auVar113._20_4_ = 0x7fffffff;
                auVar113._24_4_ = 0x7fffffff;
                auVar113._28_4_ = 0x7fffffff;
                auVar107 = ZEXT1632(auVar106);
                auVar68 = vminps_avx(ZEXT1632(auVar67),auVar107);
                auVar68 = vminps_avx(auVar68,ZEXT1632(auVar4));
                local_2500 = vandps_avx(local_24e0,auVar113);
                fVar153 = local_2500._0_4_ * 1.1920929e-07;
                fVar157 = local_2500._4_4_ * 1.1920929e-07;
                auVar35._4_4_ = fVar157;
                auVar35._0_4_ = fVar153;
                fVar159 = local_2500._8_4_ * 1.1920929e-07;
                auVar35._8_4_ = fVar159;
                fVar161 = local_2500._12_4_ * 1.1920929e-07;
                auVar35._12_4_ = fVar161;
                fVar163 = local_2500._16_4_ * 1.1920929e-07;
                auVar35._16_4_ = fVar163;
                fVar165 = local_2500._20_4_ * 1.1920929e-07;
                auVar35._20_4_ = fVar165;
                fVar166 = local_2500._24_4_ * 1.1920929e-07;
                auVar35._24_4_ = fVar166;
                auVar35._28_4_ = 0x34000000;
                auVar143._0_8_ = CONCAT44(fVar157,fVar153) ^ 0x8000000080000000;
                auVar143._8_4_ = -fVar159;
                auVar143._12_4_ = -fVar161;
                auVar143._16_4_ = -fVar163;
                auVar143._20_4_ = -fVar165;
                auVar143._24_4_ = -fVar166;
                auVar143._28_4_ = 0xb4000000;
                auVar68 = vcmpps_avx(auVar68,auVar143,5);
                auVar89 = ZEXT1632(auVar67);
                auVar12 = vmaxps_avx(auVar89,auVar107);
                auVar88 = vmaxps_avx(auVar12,ZEXT1632(auVar4));
                auVar88 = vcmpps_avx(auVar88,auVar35,2);
                auVar88 = vorps_avx(auVar68,auVar88);
                if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar88 >> 0x7f,0) != '\0') ||
                      (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar88 >> 0xbf,0) != '\0') ||
                    (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar88[0x1f] < '\0') {
                  auVar36._4_4_ = local_2440._4_4_ * fVar96;
                  auVar36._0_4_ = local_2440._0_4_ * fVar92;
                  auVar36._8_4_ = local_2440._8_4_ * fVar100;
                  auVar36._12_4_ = local_2440._12_4_ * fVar140;
                  auVar36._16_4_ = local_2440._16_4_ * fVar156;
                  auVar36._20_4_ = local_2440._20_4_ * fVar160;
                  auVar36._24_4_ = local_2440._24_4_ * fVar164;
                  auVar36._28_4_ = auVar68._28_4_;
                  auVar37._4_4_ = fVar94 * local_2460._4_4_;
                  auVar37._0_4_ = fVar85 * local_2460._0_4_;
                  auVar37._8_4_ = fVar98 * local_2460._8_4_;
                  auVar37._12_4_ = fVar102 * local_2460._12_4_;
                  auVar37._16_4_ = fVar152 * local_2460._16_4_;
                  auVar37._20_4_ = fVar158 * local_2460._20_4_;
                  auVar37._24_4_ = fVar162 * local_2460._24_4_;
                  auVar37._28_4_ = auVar12._28_4_;
                  auVar67 = vfmsub213ps_fma(local_2460,local_24a0,auVar36);
                  auVar38._4_4_ = auVar72._4_4_ * fVar146;
                  auVar38._0_4_ = auVar72._0_4_ * fVar141;
                  auVar38._8_4_ = auVar72._8_4_ * fVar147;
                  auVar38._12_4_ = auVar72._12_4_ * fVar148;
                  auVar38._16_4_ = auVar72._16_4_ * fVar149;
                  auVar38._20_4_ = auVar72._20_4_ * fVar150;
                  auVar38._24_4_ = auVar72._24_4_ * fVar151;
                  auVar38._28_4_ = 0x34000000;
                  auVar39._4_4_ = fVar94 * auVar14._4_4_;
                  auVar39._0_4_ = fVar85 * auVar14._0_4_;
                  auVar39._8_4_ = fVar98 * auVar14._8_4_;
                  auVar39._12_4_ = fVar102 * auVar14._12_4_;
                  auVar39._16_4_ = fVar152 * auVar14._16_4_;
                  auVar39._20_4_ = fVar158 * auVar14._20_4_;
                  auVar39._24_4_ = fVar162 * auVar14._24_4_;
                  auVar39._28_4_ = local_2500._28_4_;
                  auVar4 = vfmsub213ps_fma(auVar14,local_2480,auVar38);
                  auVar68 = vandps_avx(auVar36,auVar113);
                  auVar12 = vandps_avx(auVar38,auVar113);
                  auVar68 = vcmpps_avx(auVar68,auVar12,1);
                  auVar14 = vblendvps_avx(ZEXT1632(auVar4),ZEXT1632(auVar67),auVar68);
                  auVar40._4_4_ = auVar16._4_4_ * fVar96;
                  auVar40._0_4_ = auVar16._0_4_ * fVar92;
                  auVar40._8_4_ = auVar16._8_4_ * fVar100;
                  auVar40._12_4_ = auVar16._12_4_ * fVar140;
                  auVar40._16_4_ = auVar16._16_4_ * fVar156;
                  auVar40._20_4_ = auVar16._20_4_ * fVar160;
                  auVar40._24_4_ = auVar16._24_4_ * fVar164;
                  auVar40._28_4_ = auVar12._28_4_;
                  auVar67 = vfmsub213ps_fma(auVar16,local_24a0,auVar39);
                  auVar41._4_4_ = local_2420._4_4_ * fVar146;
                  auVar41._0_4_ = local_2420._0_4_ * fVar141;
                  auVar41._8_4_ = local_2420._8_4_ * fVar147;
                  auVar41._12_4_ = local_2420._12_4_ * fVar148;
                  auVar41._16_4_ = local_2420._16_4_ * fVar149;
                  auVar41._20_4_ = local_2420._20_4_ * fVar150;
                  auVar41._24_4_ = local_2420._24_4_ * fVar151;
                  auVar41._28_4_ = local_24a0._28_4_;
                  auVar4 = vfmsub213ps_fma(local_2440,local_24c0,auVar41);
                  auVar68 = vandps_avx(auVar41,auVar113);
                  auVar12 = vandps_avx(auVar39,auVar113);
                  auVar68 = vcmpps_avx(auVar68,auVar12,1);
                  auVar16 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar4),auVar68);
                  auVar67 = vfmsub213ps_fma(local_2420,local_2480,auVar37);
                  auVar4 = vfmsub213ps_fma(auVar72,local_24c0,auVar40);
                  auVar68 = vandps_avx(auVar37,auVar113);
                  auVar12 = vandps_avx(auVar40,auVar113);
                  auVar68 = vcmpps_avx(auVar68,auVar12,1);
                  auVar12 = vblendvps_avx(ZEXT1632(auVar4),ZEXT1632(auVar67),auVar68);
                  auVar67 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
                  fVar85 = auVar12._0_4_;
                  auVar71._0_4_ = fVar85 * local_2900._4_4_;
                  fVar92 = auVar12._4_4_;
                  auVar71._4_4_ = fVar92 * local_2900._4_4_;
                  fVar94 = auVar12._8_4_;
                  auVar71._8_4_ = fVar94 * local_2900._4_4_;
                  fVar96 = auVar12._12_4_;
                  auVar71._12_4_ = fVar96 * local_2900._4_4_;
                  fVar98 = auVar12._16_4_;
                  auVar71._16_4_ = fVar98 * local_2900._4_4_;
                  fVar100 = auVar12._20_4_;
                  auVar71._20_4_ = fVar100 * local_2900._4_4_;
                  fVar102 = auVar12._24_4_;
                  auVar71._24_4_ = fVar102 * local_2900._4_4_;
                  auVar71._28_4_ = 0;
                  auVar4 = vfmadd213ps_fma(auVar112,auVar16,auVar71);
                  auVar4 = vfmadd213ps_fma(auVar169,auVar14,ZEXT1632(auVar4));
                  auVar72 = ZEXT1632(CONCAT412(auVar4._12_4_ + auVar4._12_4_,
                                               CONCAT48(auVar4._8_4_ + auVar4._8_4_,
                                                        CONCAT44(auVar4._4_4_ + auVar4._4_4_,
                                                                 auVar4._0_4_ + auVar4._0_4_))));
                  auVar123._0_4_ = fVar85 * fVar86;
                  auVar123._4_4_ = fVar92 * fVar93;
                  auVar123._8_4_ = fVar94 * fVar95;
                  auVar123._12_4_ = fVar96 * fVar97;
                  auVar123._16_4_ = fVar98 * fVar99;
                  auVar123._20_4_ = fVar100 * fVar101;
                  auVar123._24_4_ = fVar102 * fVar104;
                  auVar123._28_4_ = 0;
                  auVar4 = vfmadd213ps_fma(local_23e0,auVar16,auVar123);
                  auVar5 = vfmadd213ps_fma(auVar13,auVar14,ZEXT1632(auVar4));
                  auVar68 = vrcpps_avx(auVar72);
                  auVar155._8_4_ = 0x3f800000;
                  auVar155._0_8_ = 0x3f8000003f800000;
                  auVar155._12_4_ = 0x3f800000;
                  auVar155._16_4_ = 0x3f800000;
                  auVar155._20_4_ = 0x3f800000;
                  auVar155._24_4_ = 0x3f800000;
                  auVar155._28_4_ = 0x3f800000;
                  auVar4 = vfnmadd213ps_fma(auVar68,auVar72,auVar155);
                  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar68,auVar68);
                  local_28a0._28_4_ = 0x3f800000;
                  local_28a0._0_28_ =
                       ZEXT1628(CONCAT412(auVar4._12_4_ * (auVar5._12_4_ + auVar5._12_4_),
                                          CONCAT48(auVar4._8_4_ * (auVar5._8_4_ + auVar5._8_4_),
                                                   CONCAT44(auVar4._4_4_ *
                                                            (auVar5._4_4_ + auVar5._4_4_),
                                                            auVar4._0_4_ *
                                                            (auVar5._0_4_ + auVar5._0_4_)))));
                  auVar116 = ZEXT3264(local_28a0);
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
                  auVar124._4_4_ = uVar1;
                  auVar124._0_4_ = uVar1;
                  auVar124._8_4_ = uVar1;
                  auVar124._12_4_ = uVar1;
                  auVar124._16_4_ = uVar1;
                  auVar124._20_4_ = uVar1;
                  auVar124._24_4_ = uVar1;
                  auVar124._28_4_ = uVar1;
                  auVar68 = vcmpps_avx(auVar124,local_28a0,2);
                  auVar144._4_4_ = fVar103;
                  auVar144._0_4_ = fVar103;
                  auVar144._8_4_ = fVar103;
                  auVar144._12_4_ = fVar103;
                  auVar144._16_4_ = fVar103;
                  auVar144._20_4_ = fVar103;
                  auVar144._24_4_ = fVar103;
                  auVar144._28_4_ = fVar103;
                  auVar88 = vcmpps_avx(local_28a0,auVar144,2);
                  auVar68 = vandps_avx(auVar88,auVar68);
                  auVar4 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
                  auVar67 = vpand_avx(auVar4,auVar67);
                  auVar68 = vpmovsxwd_avx2(auVar67);
                  if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar68 >> 0x7f,0) != '\0') ||
                        (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar68 >> 0xbf,0) != '\0') ||
                      (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar68[0x1f] < '\0') {
                    auVar68 = vcmpps_avx(auVar72,_DAT_01faff00,4);
                    auVar4 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
                    auVar67 = vpand_avx(auVar67,auVar4);
                    local_27a0 = vpmovsxwd_avx2(auVar67);
                    if ((((((((local_27a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (local_27a0 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (local_27a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(local_27a0 >> 0x7f,0) != '\0') ||
                          (local_27a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(local_27a0 >> 0xbf,0) != '\0') ||
                        (local_27a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_27a0[0x1f] < '\0') {
                      local_27e0 = local_24e0;
                      local_27c0 = &local_2a41;
                      auVar68 = vsubps_avx(local_24e0,auVar107);
                      auVar68 = vblendvps_avx(auVar89,auVar68,local_25e0);
                      auVar88 = vsubps_avx(local_24e0,auVar89);
                      local_2800 = vblendvps_avx(auVar107,auVar88,local_25e0);
                      local_2740 = local_28a0;
                      local_2720[0] = auVar14._0_4_ * (float)local_2600._0_4_;
                      local_2720[1] = auVar14._4_4_ * (float)local_2600._4_4_;
                      local_2720[2] = auVar14._8_4_ * fStack_25f8;
                      local_2720[3] = auVar14._12_4_ * fStack_25f4;
                      fStack_2710 = auVar14._16_4_ * fStack_25f0;
                      fStack_270c = auVar14._20_4_ * fStack_25ec;
                      fStack_2708 = auVar14._24_4_ * fStack_25e8;
                      uStack_2704 = local_25e0._28_4_;
                      local_2700[0] = (float)local_2600._0_4_ * auVar16._0_4_;
                      local_2700[1] = (float)local_2600._4_4_ * auVar16._4_4_;
                      local_2700[2] = fStack_25f8 * auVar16._8_4_;
                      local_2700[3] = fStack_25f4 * auVar16._12_4_;
                      fStack_26f0 = fStack_25f0 * auVar16._16_4_;
                      fStack_26ec = fStack_25ec * auVar16._20_4_;
                      fStack_26e8 = fStack_25e8 * auVar16._24_4_;
                      uStack_26e4 = local_25e0._28_4_;
                      local_26e0[0] = (float)local_2600._0_4_ * fVar85;
                      local_26e0[1] = (float)local_2600._4_4_ * fVar92;
                      local_26e0[2] = fStack_25f8 * fVar94;
                      local_26e0[3] = fStack_25f4 * fVar96;
                      fStack_26d0 = fStack_25f0 * fVar98;
                      fStack_26cc = fStack_25ec * fVar100;
                      fStack_26c8 = fStack_25e8 * fVar102;
                      uStack_26c4 = auVar12._28_4_;
                      auVar91._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar91._8_4_ = local_2a0c;
                      auVar91._12_4_ = local_2a0c;
                      auVar91._16_4_ = local_2a0c;
                      auVar91._20_4_ = local_2a0c;
                      auVar91._24_4_ = local_2a0c;
                      auVar91._28_4_ = local_2a0c;
                      auVar88 = vpaddd_avx2(auVar91,_DAT_01fec4a0);
                      auVar117._0_4_ = (float)(int)(*(ushort *)(local_2988 + 8 + lVar58) - 1);
                      auVar117._4_12_ = auVar106._4_12_;
                      auVar67 = vrcpss_avx(auVar117,auVar117);
                      auVar4 = vfnmadd213ss_fma(auVar67,auVar117,ZEXT416(0x40000000));
                      fVar103 = auVar67._0_4_ * auVar4._0_4_;
                      auVar88 = vcvtdq2ps_avx(auVar88);
                      fVar104 = auVar88._28_4_ + auVar68._28_4_;
                      fVar86 = (fVar74 * auVar88._0_4_ + auVar68._0_4_) * fVar103;
                      fVar93 = (fVar82 * auVar88._4_4_ + auVar68._4_4_) * fVar103;
                      local_2820._4_4_ = fVar93;
                      local_2820._0_4_ = fVar86;
                      fVar95 = (fVar83 * auVar88._8_4_ + auVar68._8_4_) * fVar103;
                      local_2820._8_4_ = fVar95;
                      fVar97 = (fVar84 * auVar88._12_4_ + auVar68._12_4_) * fVar103;
                      local_2820._12_4_ = fVar97;
                      fVar99 = (auVar88._16_4_ * 0.0 + auVar68._16_4_) * fVar103;
                      local_2820._16_4_ = fVar99;
                      fVar101 = (auVar88._20_4_ * 0.0 + auVar68._20_4_) * fVar103;
                      local_2820._20_4_ = fVar101;
                      fVar103 = (auVar88._24_4_ * 0.0 + auVar68._24_4_) * fVar103;
                      local_2820._24_4_ = fVar103;
                      local_2820._28_4_ = fVar104;
                      pGVar10 = (local_2980->geometries).items[(uint)local_28e0._4_4_].ptr;
                      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar114._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                        auVar114._8_4_ = local_2a10;
                        auVar114._12_4_ = local_2a10;
                        auVar114._16_4_ = local_2a10;
                        auVar114._20_4_ = local_2a10;
                        auVar114._24_4_ = local_2a10;
                        auVar114._28_4_ = local_2a10;
                        auVar68 = vpaddd_avx2(auVar114,_DAT_01fec4c0);
                        auVar88 = vcvtdq2ps_avx(auVar68);
                        auVar118._0_4_ = (float)(int)(*(ushort *)(local_2988 + 10 + lVar58) - 1);
                        auVar118._4_12_ = auVar106._4_12_;
                        auVar67 = vrcpss_avx(auVar118,auVar118);
                        auVar106 = vfnmadd213ss_fma(auVar67,auVar118,ZEXT416(0x40000000));
                        fVar85 = auVar67._0_4_ * auVar106._0_4_;
                        auVar68 = vrcpps_avx(local_24e0);
                        auVar125._8_4_ = 0x3f800000;
                        auVar125._0_8_ = 0x3f8000003f800000;
                        auVar125._12_4_ = 0x3f800000;
                        auVar125._16_4_ = 0x3f800000;
                        auVar125._20_4_ = 0x3f800000;
                        auVar125._24_4_ = 0x3f800000;
                        auVar125._28_4_ = 0x3f800000;
                        auVar67 = vfnmadd213ps_fma(local_24e0,auVar68,auVar125);
                        auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar68,auVar68);
                        auVar115._8_4_ = 0x219392ef;
                        auVar115._0_8_ = 0x219392ef219392ef;
                        auVar115._12_4_ = 0x219392ef;
                        auVar115._16_4_ = 0x219392ef;
                        auVar115._20_4_ = 0x219392ef;
                        auVar115._24_4_ = 0x219392ef;
                        auVar115._28_4_ = 0x219392ef;
                        auVar68 = vcmpps_avx(local_2500,auVar115,5);
                        auVar68 = vandps_avx(auVar68,ZEXT1632(auVar67));
                        auVar42._4_4_ = fVar93 * auVar68._4_4_;
                        auVar42._0_4_ = fVar86 * auVar68._0_4_;
                        auVar42._8_4_ = fVar95 * auVar68._8_4_;
                        auVar42._12_4_ = fVar97 * auVar68._12_4_;
                        auVar42._16_4_ = fVar99 * auVar68._16_4_;
                        auVar42._20_4_ = fVar101 * auVar68._20_4_;
                        auVar42._24_4_ = fVar103 * auVar68._24_4_;
                        auVar42._28_4_ = fVar104;
                        local_2780 = vminps_avx(auVar42,auVar125);
                        auVar43._4_4_ =
                             (fVar82 * auVar88._4_4_ + local_2800._4_4_) * fVar85 * auVar68._4_4_;
                        auVar43._0_4_ =
                             (fVar74 * auVar88._0_4_ + local_2800._0_4_) * fVar85 * auVar68._0_4_;
                        auVar43._8_4_ =
                             (fVar83 * auVar88._8_4_ + local_2800._8_4_) * fVar85 * auVar68._8_4_;
                        auVar43._12_4_ =
                             (fVar84 * auVar88._12_4_ + local_2800._12_4_) * fVar85 * auVar68._12_4_
                        ;
                        auVar43._16_4_ =
                             (auVar88._16_4_ * 0.0 + local_2800._16_4_) * fVar85 * auVar68._16_4_;
                        auVar43._20_4_ =
                             (auVar88._20_4_ * 0.0 + local_2800._20_4_) * fVar85 * auVar68._20_4_;
                        auVar43._24_4_ =
                             (auVar88._24_4_ * 0.0 + local_2800._24_4_) * fVar85 * auVar68._24_4_;
                        auVar43._28_4_ = auVar68._28_4_;
                        local_2760 = vminps_avx(auVar43,auVar125);
                        auVar80._8_4_ = 0x7f800000;
                        auVar80._0_8_ = 0x7f8000007f800000;
                        auVar80._12_4_ = 0x7f800000;
                        auVar80._16_4_ = 0x7f800000;
                        auVar80._20_4_ = 0x7f800000;
                        auVar80._24_4_ = 0x7f800000;
                        auVar80._28_4_ = 0x7f800000;
                        auVar68 = vblendvps_avx(auVar80,local_28a0,local_27a0);
                        auVar88 = vshufps_avx(auVar68,auVar68,0xb1);
                        auVar88 = vminps_avx(auVar68,auVar88);
                        auVar12 = vshufpd_avx(auVar88,auVar88,5);
                        auVar88 = vminps_avx(auVar88,auVar12);
                        auVar12 = vpermpd_avx2(auVar88,0x4e);
                        auVar88 = vminps_avx(auVar88,auVar12);
                        auVar88 = vcmpps_avx(auVar68,auVar88,0);
                        auVar12 = local_27a0 & auVar88;
                        auVar68 = local_27a0;
                        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar12 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar12 >> 0x7f,0) != '\0') ||
                              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar12 >> 0xbf,0) != '\0') ||
                            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar12[0x1f] < '\0') {
                          auVar68 = vandps_avx(auVar88,local_27a0);
                        }
                        uVar44 = vmovmskps_avx(auVar68);
                        uVar45 = 0;
                        for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x80000000) {
                          uVar45 = uVar45 + 1;
                        }
                        uVar59 = (ulong)uVar45;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar1 = *(undefined4 *)(local_2780 + uVar59 * 4);
                          uVar3 = *(undefined4 *)(local_2760 + uVar59 * 4);
                          fVar103 = local_2720[uVar59];
                          fVar86 = local_2700[uVar59];
                          fVar93 = local_26e0[uVar59];
                          *(float *)(ray + k * 4 + 0x80) = local_2720[uVar59 - 8];
                          *(float *)(ray + k * 4 + 0xc0) = fVar103;
                          *(float *)(ray + k * 4 + 0xd0) = fVar86;
                          *(float *)(ray + k * 4 + 0xe0) = fVar93;
                          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                          *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                          *(uint *)(ray + k * 4 + 0x110) = uVar49;
                          *(undefined4 *)(ray + k * 4 + 0x120) = local_28e0._4_4_;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_28e0._0_4_ = local_28e0._4_4_;
                          local_28e0._8_4_ = local_28e0._4_4_;
                          auStack_28d0 = auVar169._16_16_;
                          local_28e0._12_4_ = local_28e0._4_4_;
                          local_2900._4_4_ = (float)uVar49;
                          local_2900._0_4_ = uVar49;
                          uStack_28f8._0_4_ = uVar49;
                          _fStack_28f0 = auVar15._16_16_;
                          uStack_28f8._4_4_ = uVar49;
                          local_2a00 = *local_29d8;
                          auStack_28b0 = auVar112._16_16_;
                          local_28c0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                          local_2880 = local_27a0;
                          while( true ) {
                            local_2680 = *(undefined4 *)(local_2780 + uVar59 * 4);
                            local_2670 = *(undefined4 *)(local_2760 + uVar59 * 4);
                            *(float *)(ray + k * 4 + 0x80) = local_2720[uVar59 - 8];
                            local_2970.context = context->user;
                            local_26b0 = local_2720[uVar59];
                            fVar103 = local_2700[uVar59];
                            auVar105._4_4_ = fVar103;
                            auVar105._0_4_ = fVar103;
                            auVar105._8_4_ = fVar103;
                            auVar105._12_4_ = fVar103;
                            fVar103 = local_26e0[uVar59];
                            local_2690._4_4_ = fVar103;
                            local_2690._0_4_ = fVar103;
                            local_2690._8_4_ = fVar103;
                            local_2690._12_4_ = fVar103;
                            fStack_26ac = local_26b0;
                            fStack_26a8 = local_26b0;
                            fStack_26a4 = local_26b0;
                            local_26a0 = auVar105;
                            uStack_267c = local_2680;
                            uStack_2678 = local_2680;
                            uStack_2674 = local_2680;
                            uStack_266c = local_2670;
                            uStack_2668 = local_2670;
                            uStack_2664 = local_2670;
                            local_2660 = local_2900;
                            uStack_2658 = uStack_28f8;
                            local_2650 = local_28e0;
                            vpcmpeqd_avx2(ZEXT1632(local_28e0),ZEXT1632(local_28e0));
                            uStack_263c = (local_2970.context)->instID[0];
                            local_2640 = uStack_263c;
                            uStack_2638 = uStack_263c;
                            uStack_2634 = uStack_263c;
                            uStack_2630 = (local_2970.context)->instPrimID[0];
                            uStack_262c = uStack_2630;
                            uStack_2628 = uStack_2630;
                            uStack_2624 = uStack_2630;
                            local_29f0 = local_2a00;
                            local_2970.valid = (int *)local_29f0;
                            local_2970.geometryUserPtr = pGVar10->userPtr;
                            local_2970.hit = (RTCHitN *)&local_26b0;
                            local_2970.N = 4;
                            local_2970.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_2970);
                              auVar116 = ZEXT3264(local_28a0);
                            }
                            if (local_29f0 == (undefined1  [16])0x0) {
                              auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                              auVar67 = auVar67 ^ auVar106;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              auVar106 = vpcmpeqd_avx(auVar105,auVar105);
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_2970);
                                auVar116 = ZEXT3264(local_28a0);
                                auVar106 = vpcmpeqd_avx(auVar106,auVar106);
                              }
                              auVar4 = vpcmpeqd_avx(local_29f0,_DAT_01f7aa10);
                              auVar67 = auVar4 ^ auVar106;
                              if (local_29f0 != (undefined1  [16])0x0) {
                                auVar4 = auVar4 ^ auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  local_2970.hit);
                                *(undefined1 (*) [16])(local_2970.ray + 0xc0) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x10));
                                *(undefined1 (*) [16])(local_2970.ray + 0xd0) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x20));
                                *(undefined1 (*) [16])(local_2970.ray + 0xe0) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x30));
                                *(undefined1 (*) [16])(local_2970.ray + 0xf0) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x40));
                                *(undefined1 (*) [16])(local_2970.ray + 0x100) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x50));
                                *(undefined1 (*) [16])(local_2970.ray + 0x110) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x60));
                                *(undefined1 (*) [16])(local_2970.ray + 0x120) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x70));
                                *(undefined1 (*) [16])(local_2970.ray + 0x130) = auVar106;
                                auVar106 = vmaskmovps_avx(auVar4,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x80));
                                *(undefined1 (*) [16])(local_2970.ray + 0x140) = auVar106;
                              }
                            }
                            auVar68 = _local_28c0;
                            auVar76._8_8_ = 0x100000001;
                            auVar76._0_8_ = 0x100000001;
                            if ((auVar76 & auVar67) == (undefined1  [16])0x0) {
                              *(undefined4 *)(ray + k * 4 + 0x80) = local_28c0._0_4_;
                            }
                            else {
                              local_28c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_28c0._4_4_ = 0;
                              local_28c0._8_4_ = 0;
                              local_28c0._12_4_ = 0;
                            }
                            *(undefined4 *)(local_2880 + uVar59 * 4) = 0;
                            auStack_28b0 = auVar68._16_16_;
                            auVar73._4_4_ = local_28c0._0_4_;
                            auVar73._0_4_ = local_28c0._0_4_;
                            auVar73._8_4_ = local_28c0._0_4_;
                            auVar73._12_4_ = local_28c0._0_4_;
                            auVar73._16_4_ = local_28c0._0_4_;
                            auVar73._20_4_ = local_28c0._0_4_;
                            auVar73._24_4_ = local_28c0._0_4_;
                            auVar73._28_4_ = local_28c0._0_4_;
                            auVar88 = vcmpps_avx(auVar116._0_32_,auVar73,2);
                            auVar68 = vandps_avx(auVar88,local_2880);
                            local_2880 = local_2880 & auVar88;
                            if ((((((((local_2880 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_2880 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_2880 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(local_2880 >> 0x7f,0) == '\0')
                                  && (local_2880 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && SUB321(local_2880 >> 0xbf,0) == '\0')
                                && (local_2880 & (undefined1  [32])0x100000000) ==
                                   (undefined1  [32])0x0) && -1 < local_2880[0x1f]) break;
                            auVar81._8_4_ = 0x7f800000;
                            auVar81._0_8_ = 0x7f8000007f800000;
                            auVar81._12_4_ = 0x7f800000;
                            auVar81._16_4_ = 0x7f800000;
                            auVar81._20_4_ = 0x7f800000;
                            auVar81._24_4_ = 0x7f800000;
                            auVar81._28_4_ = 0x7f800000;
                            auVar88 = vblendvps_avx(auVar81,auVar116._0_32_,auVar68);
                            auVar12 = vshufps_avx(auVar88,auVar88,0xb1);
                            auVar12 = vminps_avx(auVar88,auVar12);
                            auVar13 = vshufpd_avx(auVar12,auVar12,5);
                            auVar12 = vminps_avx(auVar12,auVar13);
                            auVar13 = vpermpd_avx2(auVar12,0x4e);
                            auVar12 = vminps_avx(auVar12,auVar13);
                            auVar12 = vcmpps_avx(auVar88,auVar12,0);
                            auVar13 = auVar68 & auVar12;
                            auVar88 = auVar68;
                            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar13 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar13 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar13 >> 0x7f,0) != '\0') ||
                                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar13 >> 0xbf,0) != '\0') ||
                                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar13[0x1f] < '\0') {
                              auVar88 = vandps_avx(auVar12,auVar68);
                            }
                            uVar45 = vmovmskps_avx(auVar88);
                            uVar49 = 0;
                            for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x80000000) {
                              uVar49 = uVar49 + 1;
                            }
                            uVar59 = (ulong)uVar49;
                            local_2880 = auVar68;
                          }
                        }
                      }
                    }
                  }
                }
                auVar145 = ZEXT3264(local_2540);
                auVar170 = ZEXT3264(local_25c0);
                auVar171 = ZEXT3264(local_2520);
                pauVar46 = local_2a40;
                uVar59 = local_2a18;
                uVar60 = local_2a20;
                uVar61 = local_2a28;
                uVar62 = local_2a38;
                uVar64 = local_2a30;
                fVar152 = local_2560;
                fVar156 = fStack_255c;
                fVar158 = fStack_2558;
                fVar160 = fStack_2554;
                fVar162 = fStack_2550;
                fVar164 = fStack_254c;
                fVar97 = fStack_2548;
                fVar82 = local_2580;
                fVar83 = fStack_257c;
                fVar84 = fStack_2578;
                fVar141 = fStack_2574;
                fVar146 = fStack_2570;
                fVar147 = fStack_256c;
                fVar86 = fStack_2568;
                fVar148 = local_25a0;
                fVar149 = fStack_259c;
                fVar150 = fStack_2598;
                fVar151 = fStack_2594;
                fVar153 = fStack_2590;
                fVar157 = fStack_258c;
                fVar93 = fStack_2588;
              }
              local_2978 = local_2978 - 1 & local_2978;
            } while (local_2978 != 0);
          }
          local_2998 = local_2998 + 1;
          fVar94 = local_2620;
          fVar96 = fStack_261c;
          fVar98 = fStack_2618;
          fVar100 = fStack_2614;
          fVar102 = fStack_2610;
          fVar140 = fStack_260c;
          fVar95 = fStack_2608;
        } while (local_2998 != local_29a0);
      }
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar171 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      auVar126 = ZEXT3264(local_2920);
      auVar132 = ZEXT3264(local_2940);
      auVar116 = ZEXT3264(_local_2860);
      fVar103 = local_2840;
      fVar99 = fStack_283c;
      fVar101 = fStack_2838;
      fVar104 = fStack_2834;
      fVar85 = fStack_2830;
      fVar74 = fStack_282c;
      fVar92 = fStack_2828;
    }
    if (pauVar46 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }